

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::instantiate(ModuleRunnerBase<wasm::ModuleRunner> *this)

{
  char *pcVar1;
  size_t sVar2;
  Name name;
  SmallVector<wasm::Literal,_1UL> local_d0;
  undefined1 auStack_98 [8];
  Literals arguments;
  SmallVector<wasm::Literal,_1UL> local_58;
  
  (*this->externalInterface->_vptr_ExternalInterface[3])
            (this->externalInterface,&this->globals,this->wasm);
  ModuleUtils::
  iterDefinedGlobals<wasm::ModuleRunnerBase<wasm::ModuleRunner>::instantiate()::_lambda(wasm::Global*)_1_>
            (this->wasm,(anon_class_8_1_8991fb9c)this);
  (*this->externalInterface->_vptr_ExternalInterface[2])(this->externalInterface,this->wasm,this);
  initializeTableContents(this);
  initializeMemoryContents(this);
  pcVar1 = (this->wasm->start).super_IString.str._M_str;
  if (pcVar1 != (char *)0x0) {
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str
    ._M_str = (char *)0x0;
    auStack_98 = (undefined1  [8])0x0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar2 = (this->wasm->start).super_IString.str._M_len;
    SmallVector<wasm::Literal,_1UL>::SmallVector
              (&local_58,(SmallVector<wasm::Literal,_1UL> *)auStack_98);
    name.super_IString.str._M_str = pcVar1;
    name.super_IString.str._M_len = sVar2;
    callFunction((Literals *)&local_d0,this,name,(Literals *)&local_58);
    SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_d0);
    SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_58);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
  }
  return;
}

Assistant:

void instantiate() {
    // import globals from the outside
    externalInterface->importGlobals(globals, wasm);
    // generate internal (non-imported) globals
    ModuleUtils::iterDefinedGlobals(wasm, [&](Global* global) {
      globals[global->name] = self()->visit(global->init).values;
    });

    // initialize the rest of the external interface
    externalInterface->init(wasm, *self());

    initializeTableContents();
    initializeMemoryContents();

    // run start, if present
    if (wasm.start.is()) {
      Literals arguments;
      callFunction(wasm.start, arguments);
    }
  }